

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bss_section.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_26070::BssSection::BssSection(BssSection *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__BssSection_0023b130;
  in_memory_store::in_memory_store(&this->export_store_);
  pstore::database::database<pstore::file::in_memory>
            (&this->export_db_,&(this->export_store_).file_,true);
  in_memory_store::in_memory_store(&this->import_store_);
  pstore::database::database<pstore::file::in_memory>
            (&this->import_db_,&(this->import_store_).file_,true);
  (this->export_db_).vacuum_mode_ = disabled;
  (this->import_db_).vacuum_mode_ = disabled;
  return;
}

Assistant:

BssSection ()
                : export_store_{}
                , export_db_{export_store_.file ()}
                , import_store_{}
                , import_db_{import_store_.file ()} {
            export_db_.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
            import_db_.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
        }